

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::iterate(InvarianceTest *this)

{
  ostringstream *poVar1;
  ShaderProgram *pSVar2;
  RenderContext *pRVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  int iVar11;
  char *pcVar12;
  qpTestResult testResult;
  Vector<float,_4> *pVVar13;
  char *pcVar14;
  bool bVar15;
  Surface resultSurface;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  Vec4 color;
  MessageBuilder local_1b0;
  long lVar9;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = pRVar10->m_depthBits;
  tcu::Surface::Surface(&resultSurface,this->m_renderSize,this->m_renderSize);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar9 + 0x40))(0x8892,this->m_arrayBuf);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                  ,0x10c);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Testing position invariance.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  for (iVar11 = 1; iVar11 != 3; iVar11 = iVar11 + 1) {
    pSVar2 = (&this->m_shader0)[iVar11 != 1];
    uVar7 = (**(code **)(lVar9 + 0x780))((pSVar2->m_program).m_program,"a_input");
    uVar8 = (**(code **)(lVar9 + 0xb48))((pSVar2->m_program).m_program,"u_color");
    local_1d8.m_data[0] = 1.0;
    local_1d8.m_data[1] = 0.0;
    local_1d8.m_data[2] = 0.0;
    local_1d8.m_data[3] = 1.0;
    local_1e8.m_data[0] = 0.0;
    local_1e8.m_data[1] = 1.0;
    local_1e8.m_data[2] = 0.0;
    local_1e8.m_data[3] = 1.0;
    pVVar13 = &local_1e8;
    if (iVar11 == 1) {
      pVVar13 = &local_1d8;
    }
    pcVar12 = "green";
    if (iVar11 == 1) {
      pcVar12 = "red - purple";
    }
    tcu::Vector<float,_4>::Vector(&color,pVVar13);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Drawing position test pattern using shader ");
    std::ostream::operator<<(poVar1,iVar11);
    std::operator<<((ostream *)poVar1,". Primitive color: ");
    std::operator<<((ostream *)poVar1,pcVar12);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar9 + 0x1680))((pSVar2->m_program).m_program);
    (**(code **)(lVar9 + 0x15a8))(uVar8,1,&color);
    (**(code **)(lVar9 + 0x610))(uVar7);
    (**(code **)(lVar9 + 0x19f0))(uVar7,4,0x1406,0,0x10);
    (**(code **)(lVar9 + 0x538))(4,0,this->m_verticesInPattern);
    (**(code **)(lVar9 + 0x518))(uVar7);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"draw pass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                    ,0x123);
  }
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&resultSurface);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&local_1b0);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying output. Expecting only green or background colored pixels.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  bVar4 = checkImage(this,&resultSurface);
  if (iVar5 == 0) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Depth buffer not available, skipping z-test.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (!bVar4) goto LAB_0066e45c;
  }
  else {
    (**(code **)(lVar9 + 0x1d0))(0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4100);
    (**(code **)(lVar9 + 0x5e0))(0xb71);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Testing position invariance with z-test. Enabling GL_DEPTH_TEST.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    for (iVar5 = 1; iVar5 != 3; iVar5 = iVar5 + 1) {
      pSVar2 = (&this->m_shader0)[iVar5 != 1];
      uVar7 = (**(code **)(lVar9 + 0x780))((pSVar2->m_program).m_program,"a_input");
      uVar8 = (**(code **)(lVar9 + 0xb48))((pSVar2->m_program).m_program,"u_color");
      local_1d8.m_data[0] = 1.0;
      local_1d8.m_data[1] = 0.0;
      local_1d8.m_data[2] = 0.0;
      local_1d8.m_data[3] = 1.0;
      local_1e8.m_data[0] = 0.0;
      local_1e8.m_data[1] = 1.0;
      local_1e8.m_data[2] = 0.0;
      local_1e8.m_data[3] = 1.0;
      bVar15 = iVar5 == 1;
      pVVar13 = &local_1e8;
      if (bVar15) {
        pVVar13 = &local_1d8;
      }
      pcVar12 = "GL_EQUAL";
      if (bVar15) {
        pcVar12 = "GL_ALWAYS";
      }
      pcVar14 = "green";
      if (bVar15) {
        pcVar14 = "red - purple";
      }
      tcu::Vector<float,_4>::Vector(&color,pVVar13);
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Drawing Z-test pattern using shader ");
      std::ostream::operator<<(poVar1,iVar5);
      std::operator<<((ostream *)poVar1,". Primitive color: ");
      std::operator<<((ostream *)poVar1,pcVar14);
      std::operator<<((ostream *)poVar1,". DepthFunc: ");
      std::operator<<((ostream *)poVar1,pcVar12);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      (**(code **)(lVar9 + 0x1680))((pSVar2->m_program).m_program);
      (**(code **)(lVar9 + 0x15a8))(uVar8,1,&color);
      (**(code **)(lVar9 + 0x4a0))((uint)bVar15 * 5 + 0x202);
      (**(code **)(lVar9 + 0x610))(uVar7);
      (**(code **)(lVar9 + 0x19f0))(uVar7,4,0x1406,0,0x10,0);
      (**(code **)(lVar9 + 0x538))(4,this->m_verticesInPattern);
      (**(code **)(lVar9 + 0x518))(uVar7);
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"draw pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                      ,0x150);
    }
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&resultSurface);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&local_1b0);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Verifying output. Expecting only green or background colored pixels.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar15 = checkImage(this,&resultSurface);
    if (!bVar4 || !bVar15) {
LAB_0066e45c:
      pcVar12 = "Detected variance between two invariant values";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0066e466;
    }
  }
  pcVar12 = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_0066e466:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar12);
  tcu::Surface::~Surface(&resultSurface);
  return STOP;
}

Assistant:

InvarianceTest::IterateResult InvarianceTest::iterate (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				depthBufferExists	= m_context.getRenderTarget().getDepthBits() != 0;
	tcu::Surface			resultSurface		(m_renderSize, m_renderSize);
	bool					error				= false;

	// Prepare draw
	gl.clearColor		(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear			(GL_COLOR_BUFFER_BIT);
	gl.viewport			(0, 0, m_renderSize, m_renderSize);
	gl.bindBuffer		(GL_ARRAY_BUFFER, m_arrayBuf);
	GLU_EXPECT_NO_ERROR	(gl.getError(), "setup draw");

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance." << tcu::TestLog::EndMessage;

	// Draw position check passes
	for (int passNdx = 0; passNdx < 2; ++passNdx)
	{
		const glu::ShaderProgram&	shader		= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
		const glw::GLint			positionLoc = gl.getAttribLocation(shader.getProgram(), "a_input");
		const glw::GLint			colorLoc	= gl.getUniformLocation(shader.getProgram(), "u_color");
		const tcu::Vec4				red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		const tcu::Vec4				green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
		const tcu::Vec4				color		= (passNdx == 0) ? (red) : (green);
		const char* const			colorStr	= (passNdx == 0) ? ("red - purple") : ("green");

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing position test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << "." << tcu::TestLog::EndMessage;

		gl.useProgram				(shader.getProgram());
		gl.uniform4fv				(colorLoc, 1, color.getPtr());
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
		gl.drawArrays				(GL_TRIANGLES, 0, m_verticesInPattern);
		gl.disableVertexAttribArray	(positionLoc);
		GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
	}

	// Read result
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	// Check there are no red pixels
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
	error |= !checkImage(resultSurface);

	if (!depthBufferExists)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth buffer not available, skipping z-test." << tcu::TestLog::EndMessage;
	}
	else
	{
		// Test with Z-test
		gl.clearDepthf		(1.0f);
		gl.clear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.enable			(GL_DEPTH_TEST);

		m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance with z-test. Enabling GL_DEPTH_TEST." << tcu::TestLog::EndMessage;

		// Draw position check passes
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const glu::ShaderProgram&	shader			= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
			const glw::GLint			positionLoc		= gl.getAttribLocation(shader.getProgram(), "a_input");
			const glw::GLint			colorLoc		= gl.getUniformLocation(shader.getProgram(), "u_color");
			const tcu::Vec4				red				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
			const tcu::Vec4				green			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
			const tcu::Vec4				color			= (passNdx == 0) ? (red) : (green);
			const glw::GLenum			depthFunc		= (passNdx == 0) ? (GL_ALWAYS) : (GL_EQUAL);
			const char* const			depthFuncStr	= (passNdx == 0) ? ("GL_ALWAYS") : ("GL_EQUAL");
			const char* const			colorStr		= (passNdx == 0) ? ("red - purple") : ("green");

			m_testCtx.getLog() << tcu::TestLog::Message << "Drawing Z-test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << ". DepthFunc: " << depthFuncStr << tcu::TestLog::EndMessage;

			gl.useProgram				(shader.getProgram());
			gl.uniform4fv				(colorLoc, 1, color.getPtr());
			gl.depthFunc				(depthFunc);
			gl.enableVertexAttribArray	(positionLoc);
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
			gl.drawArrays				(GL_TRIANGLES, m_verticesInPattern, m_verticesInPattern); // !< buffer contains 2 m_verticesInPattern-sized patterns
			gl.disableVertexAttribArray	(positionLoc);
			GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
		}

		// Read result
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

		// Check there are no red pixels
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
		error |= !checkImage(resultSurface);
	}

	// Report result
	if (error)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected variance between two invariant values");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}